

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_tuv(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_DBL *param)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  REF_INT geom;
  int local_3c;
  long local_38;
  
  uVar2 = ref_geom_find(ref_geom,node,type,id,&local_3c);
  if (uVar2 == 0) {
    lVar3 = (long)local_3c;
    iVar1 = ref_geom->descr[lVar3 * 6 + 3];
    local_38 = lVar3;
    if ((long)iVar1 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2b2,
             "ref_geom_tuv","use ref_geom_cell_tuv for jumps",0,(long)iVar1);
      uVar2 = 1;
    }
    if (iVar1 == 0) {
      iVar1 = ref_geom->descr[lVar3 * 6 + 4];
      if ((long)iVar1 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x2b3,"ref_geom_tuv","use ref_geom_cell_tuv for degen",0,(long)iVar1);
        uVar2 = 1;
      }
      if (iVar1 == 0) {
        if (0 < type) {
          *param = ref_geom->param[local_38 * 2];
        }
        uVar2 = 0;
        if (1 < type) {
          param[1] = ref_geom->param[(int)local_38 * 2 + 1];
          uVar2 = 0;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2b0,
           "ref_geom_tuv",(ulong)uVar2,"not found");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tuv(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                REF_INT id, REF_DBL *param) {
  REF_INT geom;

  RSS(ref_geom_find(ref_geom, node, type, id, &geom), "not found");

  REIS(0, ref_geom_jump(ref_geom, geom), "use ref_geom_cell_tuv for jumps");
  REIS(0, ref_geom_degen(ref_geom, geom), "use ref_geom_cell_tuv for degen");

  if (type > 0) param[0] = ref_geom_param(ref_geom, 0, geom);
  if (type > 1) param[1] = ref_geom_param(ref_geom, 1, geom);

  return REF_SUCCESS;
}